

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O2

void std::
     __move_median_to_first<spirv_cross::TypedID<(spirv_cross::Types)2>*,__gnu_cxx::__ops::_Iter_less_iter>
               (uint *__result,uint *__a,uint *__b,uint *__c)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = *__a;
  uVar2 = *__b;
  uVar3 = *__c;
  if (uVar2 <= uVar1) {
    if (uVar1 < uVar3) {
      uVar2 = *__result;
      *__result = uVar1;
      *__a = uVar2;
      return;
    }
    uVar1 = *__result;
    if (uVar2 < uVar3) {
      *__result = uVar3;
      *__c = uVar1;
      return;
    }
    *__result = uVar2;
    *__b = uVar1;
    return;
  }
  if (uVar2 < uVar3) {
    uVar1 = *__result;
    *__result = uVar2;
    *__b = uVar1;
    return;
  }
  uVar2 = *__result;
  if (uVar1 < uVar3) {
    *__result = uVar3;
    *__c = uVar2;
    return;
  }
  *__result = uVar1;
  *__a = uVar2;
  return;
}

Assistant:

operator uint32_t() const
	{
		return id;
	}